

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O3

void sysbvm_identityDictionary_atPut
               (sysbvm_context_t *context,sysbvm_tuple_t dictionary,sysbvm_tuple_t key,
               sysbvm_tuple_t value)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  sysbvm_tuple_t sVar4;
  ulong uVar5;
  ulong uVar6;
  int64_t svalue;
  
  if ((dictionary & 0xf) == 0 && dictionary != 0) {
    lVar3 = sysbvm_identityDictionary_scanFor(dictionary,key);
    if (lVar3 < 0) {
      sysbvm_identityDictionary_increaseCapacity(context,dictionary);
      lVar3 = sysbvm_identityDictionary_scanFor(dictionary,key);
      if (lVar3 < 0) {
        sysbvm_error("Dictionary out of memory.");
      }
    }
    lVar1 = *(long *)(dictionary + 0x18);
    uVar6 = *(ulong *)(lVar1 + 0x10 + lVar3 * 8);
    if (uVar6 == 0) {
      sVar4 = sysbvm_association_create(context,key,value);
      *(sysbvm_tuple_t *)(lVar1 + 0x10 + lVar3 * 8) = sVar4;
      uVar6 = *(ulong *)(dictionary + 0x18);
      if ((uVar6 & 0xf) == 0 && uVar6 != 0) {
        uVar6 = (ulong)(*(uint *)(uVar6 + 0xc) >> 1 & 0xfffffffc) / 5;
      }
      else {
        uVar6 = 0;
      }
      uVar2 = *(ulong *)(dictionary + 0x10);
      if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
        lVar3 = (long)uVar2 >> 4;
      }
      else {
        lVar3 = *(long *)(uVar2 + 0x10);
      }
      uVar2 = lVar3 + 1;
      if (lVar3 + 0x800000000000001U >> 0x3c == 0) {
        uVar5 = uVar2 * 0x10 | 0xb;
      }
      else {
        uVar5 = sysbvm_tuple_uint64_encodeBig(context,uVar2);
      }
      *(ulong *)(dictionary + 0x10) = uVar5;
      if (uVar6 <= uVar2) {
        sysbvm_identityDictionary_increaseCapacity(context,dictionary);
        return;
      }
    }
    else if (((uVar6 & 0xf) == 0) && (0xf < *(uint *)(uVar6 + 0xc))) {
      *(sysbvm_tuple_t *)(uVar6 + 0x18) = value;
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_identityDictionary_atPut(sysbvm_context_t *context, sysbvm_tuple_t dictionary, sysbvm_tuple_t key, sysbvm_tuple_t value)
{
    if(!sysbvm_tuple_isNonNullPointer(dictionary))
        return;

    intptr_t elementIndex = sysbvm_identityDictionary_scanFor(dictionary, key);
    if(elementIndex < 0)
    {
        sysbvm_identityDictionary_increaseCapacity(context, dictionary);
        elementIndex = sysbvm_identityDictionary_scanFor(dictionary, key);
        if(elementIndex < 0)
           sysbvm_error("Dictionary out of memory.");
    }

    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *storage = (sysbvm_array_t*)dictionaryObject->storage;
    if(storage->elements[elementIndex])
    {
        sysbvm_association_setValue(storage->elements[elementIndex], value);
    }
    else
    {
        storage->elements[elementIndex] = sysbvm_association_create(context, key, value);
        size_t capacity = sysbvm_tuple_getSizeInSlots(dictionaryObject->storage);
        size_t newSize = sysbvm_tuple_size_decode(dictionaryObject->size) + 1;
        dictionaryObject->size = sysbvm_tuple_size_encode(context, newSize);
        size_t capacityThreshold = capacity * 4 / 5;

        // Make sure the maximum occupancy rate is not greater than 80%.
        if(newSize >= capacityThreshold)
            sysbvm_identityDictionary_increaseCapacity(context, dictionary);
    }
}